

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O0

JL_STATUS JlBufferFree(JlBuffer **pBufferContext)

{
  JL_STATUS local_14;
  JL_STATUS jlStatus;
  JlBuffer **pBufferContext_local;
  
  if ((pBufferContext == (JlBuffer **)0x0) || (*pBufferContext == (JlBuffer *)0x0)) {
    local_14 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    WjTestLib_Free((*pBufferContext)->Buffer);
    WjTestLib_Free(*pBufferContext);
    *pBufferContext = (JlBuffer *)0x0;
    local_14 = JL_STATUS_SUCCESS;
  }
  return local_14;
}

Assistant:

JL_STATUS
    JlBufferFree
    (
        JlBuffer**      pBufferContext
    )
{
    JL_STATUS jlStatus;

    if(     NULL != pBufferContext
        &&  NULL != *pBufferContext )
    {
        JlFree( (*pBufferContext)->Buffer );
        JlFree( *pBufferContext );
        *pBufferContext = NULL;

        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}